

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

FlattenedField * __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this,
          FlattenedField *params)

{
  FlattenedField *pFVar1;
  
  capnp::JsonCodec::AnnotatedHandler::FlattenedField::FlattenedField(this->pos,params);
  pFVar1 = this->pos;
  this->pos = pFVar1 + 1;
  return pFVar1;
}

Assistant:

T& add(Params&&... params) KJ_LIFETIMEBOUND {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }